

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O1

void __thiscall Fl_Hor_Slider::Fl_Hor_Slider(Fl_Hor_Slider *this,int X,int Y,int W,int H,char *l)

{
  Fl_Valuator::Fl_Valuator((Fl_Valuator *)this,X,Y,W,H,l);
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_ = '\x03';
  *(undefined4 *)&(this->super_Fl_Slider).super_Fl_Valuator.field_0xa4 = 0;
  (this->super_Fl_Slider).slider_ = '\0';
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Widget_0024f1b8;
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  return;
}

Assistant:

Fl_Hor_Slider::Fl_Hor_Slider(int X,int Y,int W,int H,const char *l)
: Fl_Slider(X,Y,W,H,l) {
  type(FL_HOR_SLIDER);
}